

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

uint8_t duckdb::GetCandidateSpecificity(LogicalType *candidate_type)

{
  uint8_t uVar1;
  const_iterator cVar2;
  BinderException *this;
  allocator local_9b;
  uint8_t id;
  undefined1 local_99;
  string local_98;
  string local_78;
  unordered_map<unsigned_char,_unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  auto_type_candidates_specificity;
  
  local_98.field_2._4_8_ = 0xd010c0a0b100a0f;
  local_98._M_dataplus._M_p._0_4_ = 0x1170019;
  local_98._M_dataplus._M_p._4_4_ = 0x3150216;
  local_98._M_string_length._0_4_ = 0x50d040e;
  local_98._12_8_ = 0x9130820070b060c;
  ::std::
  _Hashtable<unsigned_char,std::pair<unsigned_char_const,unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_char>>,std::__detail::_Select1st,std::equal_to<unsigned_char>,std::hash<unsigned_char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_char_const,unsigned_char>const*>
            ((_Hashtable<unsigned_char,std::pair<unsigned_char_const,unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_char>>,std::__detail::_Select1st,std::equal_to<unsigned_char>,std::hash<unsigned_char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&auto_type_candidates_specificity._M_h,&local_98,
             (undefined1 *)((long)&local_98.field_2 + 0xc),0,&id,&local_9b,&local_99);
  id = candidate_type->id_;
  cVar2 = ::std::
          _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&auto_type_candidates_specificity._M_h,&id);
  if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_char,_unsigned_char>,_false>._M_cur
      != (__node_type *)0x0) {
    uVar1 = *(uint8_t *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<const_unsigned_char,_unsigned_char>,_false>.
                    _M_cur + 9);
    ::std::
    _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&auto_type_candidates_specificity._M_h);
    return uVar1;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_98,"Auto Type Candidate of type %s is not accepted as a valid input",
             &local_9b);
  EnumUtil::ToString<duckdb::LogicalTypeId>(&local_78,candidate_type->id_);
  BinderException::BinderException<std::__cxx11::string>(this,&local_98,&local_78);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static uint8_t GetCandidateSpecificity(const LogicalType &candidate_type) {
	//! Const ht with accepted auto_types and their weights in specificity
	const duckdb::unordered_map<uint8_t, uint8_t> auto_type_candidates_specificity {
	    {static_cast<uint8_t>(LogicalTypeId::VARCHAR), 0},      {static_cast<uint8_t>(LogicalTypeId::DOUBLE), 1},
	    {static_cast<uint8_t>(LogicalTypeId::FLOAT), 2},        {static_cast<uint8_t>(LogicalTypeId::DECIMAL), 3},
	    {static_cast<uint8_t>(LogicalTypeId::BIGINT), 4},       {static_cast<uint8_t>(LogicalTypeId::INTEGER), 5},
	    {static_cast<uint8_t>(LogicalTypeId::SMALLINT), 6},     {static_cast<uint8_t>(LogicalTypeId::TINYINT), 7},
	    {static_cast<uint8_t>(LogicalTypeId::TIMESTAMP_TZ), 8}, {static_cast<uint8_t>(LogicalTypeId::TIMESTAMP), 9},
	    {static_cast<uint8_t>(LogicalTypeId::DATE), 10},        {static_cast<uint8_t>(LogicalTypeId::TIME), 11},
	    {static_cast<uint8_t>(LogicalTypeId::BOOLEAN), 12},     {static_cast<uint8_t>(LogicalTypeId::SQLNULL), 13}};

	auto id = static_cast<uint8_t>(candidate_type.id());
	auto it = auto_type_candidates_specificity.find(id);
	if (it == auto_type_candidates_specificity.end()) {
		throw BinderException("Auto Type Candidate of type %s is not accepted as a valid input",
		                      EnumUtil::ToString(candidate_type.id()));
	}
	return it->second;
}